

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_private.c
# Opt level: O1

char * zt_log_gen_fmt(zt_log_ty *log,char *fmt,char *file,int line,char *function,zt_log_level level
                     ,uint opts)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *__dest;
  tm *__tp;
  char *pcVar4;
  size_t sVar5;
  size_t num;
  time_t tt;
  char sbuf [255];
  time_t local_140;
  char local_138 [264];
  
  sVar3 = strlen(fmt);
  num = sVar3 + 4;
  __dest = (char *)zt_calloc_p(num,1);
  if ((opts & 1) != 0) {
    local_140 = time((time_t *)0x0);
    __tp = localtime(&local_140);
    sVar3 = strftime(local_138,0xfe,"%b %d %H:%M:%S ",__tp);
    num = num + sVar3;
    __dest = (char *)zt_realloc_p(__dest,num);
    strcpy(__dest,local_138);
  }
  if ((opts & 4) != 0) {
    iVar1 = gethostname(local_138,0xfe);
    if (iVar1 == -1) {
      builtin_strncpy(local_138,"*hostname*",0xb);
    }
    pcVar4 = strchr(local_138,0x2e);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
    }
    sVar3 = strlen(local_138);
    num = num + sVar3 + 1;
    __dest = (char *)zt_realloc_p(__dest,num);
    strcat(__dest,local_138);
    if (4 < opts) {
      sVar3 = strlen(__dest);
      (__dest + sVar3)[0] = ' ';
      (__dest + sVar3)[1] = '\0';
    }
  }
  if ((opts & 8) != 0) {
    pcVar4 = zt_progname((char *)0x0,0);
    sVar3 = strlen(pcVar4);
    num = num + sVar3;
    __dest = (char *)zt_realloc_p(__dest,num);
    pcVar4 = zt_progname((char *)0x0,0);
    strcat(__dest,pcVar4);
  }
  if ((opts & 0x10) != 0) {
    uVar2 = getpid();
    sprintf(local_138,"[%u]",(ulong)uVar2);
    sVar3 = strlen(local_138);
    num = num + sVar3;
    __dest = (char *)zt_realloc_p(__dest,num);
    strcat(__dest,local_138);
  }
  if (level < zt_log_max && (opts & 2) != 0) {
    sVar3 = strlen(zt_log_level_desc[level].desc);
    num = num + sVar3 + 2;
    __dest = (char *)zt_realloc_p(__dest,num);
    if (opts != 2) {
      sVar3 = strlen(__dest);
      (__dest + sVar3)[0] = ':';
      (__dest + sVar3)[1] = ' ';
      __dest[sVar3 + 2] = '\0';
    }
    strcat(__dest,zt_log_level_desc[level].desc);
  }
  if (opts != 0) {
    sVar3 = strlen(__dest);
    (__dest + sVar3)[0] = ':';
    (__dest + sVar3)[1] = ' ';
    __dest[sVar3 + 2] = '\0';
  }
  strcat(__dest,fmt);
  if ((function != (char *)0x0 && file != (char *)0x0) && -1 < line) {
    sVar3 = strlen(file);
    sVar5 = strlen(function);
    pcVar4 = (char *)zt_calloc_p(sVar3 + sVar5 + 0x17,1);
    sprintf(pcVar4,": in %s at (%s:%d)",function,file,(ulong)(uint)line);
    __dest = (char *)zt_realloc_p(__dest,sVar3 + sVar5 + num + 0x17);
    strcat(__dest,pcVar4);
    if (pcVar4 != (char *)0x0) {
      free(pcVar4);
    }
  }
  sVar3 = strlen(__dest);
  (__dest + sVar3)[0] = '\n';
  (__dest + sVar3)[1] = '\0';
  return __dest;
}

Assistant:

char*
zt_log_gen_fmt(zt_log_ty * log, const char * fmt, const char * file, int line, const char * function, zt_log_level level, unsigned int opts) {
    size_t len  = 0;
    char * buff = NULL;

    len  = strlen(fmt) + 4;   /* format + seperator + "\n" + null */
    buff = (char*)zt_calloc(char, len);  /* mem_calloc(len, sizeof(char)); */

    if (opts & ZT_LOG_WITH_DATE) {
        char   sbuf[255];
        time_t tt = time(NULL);

        len += strftime(sbuf, 254, "%b %d %H:%M:%S ", localtime(&tt));

        buff = zt_realloc(char, buff, len);
        sprintf(buff, "%s", sbuf);
    }

    if (opts & ZT_LOG_WITH_SYSNAME) {
        char   sbuf[255];
        char * t = NULL;

        if (gethostname(sbuf, 254) == -1) {
            sprintf(sbuf, "*hostname*");
        }
        t    = strchr(sbuf, '.');
        if (t) {
            *t = '\0';
        }
        len += strlen(sbuf) + 1;    /* sbuf + space */
        buff = zt_realloc(char, buff, len);
        strcat(buff, sbuf);
        if ((opts > ZT_LOG_WITH_SYSNAME)) {
            strcat(buff, " ");
        }
    }

    if (opts & ZT_LOG_WITH_PROGNAME) {
        len += strlen(zt_progname(NULL, 0)); /* progname */
        buff = zt_realloc(char, buff, len);
        strcat(buff, zt_progname(NULL, 0));
    }

    if (opts & ZT_LOG_WITH_PID) {
        char  sbuf[10 + 3];       /* pid + [] + null */
        pid_t pid = getpid();

        sprintf(sbuf, "[%u]", pid);
        len += strlen(sbuf);
        buff = zt_realloc(char, buff, len);
        strcat(buff, sbuf);
    }

    if (opts & ZT_LOG_WITH_LEVEL) {
        if ((level < zt_log_max) && ((int)level >= zt_log_emerg)) {
            len += strlen(zt_log_level_desc[level].desc) + 2; /* ': ' + level desc */
            buff = zt_realloc(char, buff, len);
            if (opts != ZT_LOG_WITH_LEVEL) {
                strcat(buff, ": ");
            }
            strcat(buff, zt_log_level_desc[level].desc);
        }
    }
    if (opts != ZT_LOG_RAW) {
        strcat(buff, ": ");
    }
    strcat(buff, fmt);
    if (((file) && (line > -1) && (function))) {
        char * nbuff = NULL;
        size_t nlen  = 13;    /* ': in  at (:)' + null */

        nlen += strlen(file);
        nlen += strlen(function);
        nlen += 10;    /* length of a int to str */
        nbuff = zt_calloc(char, nlen); /* mem_calloc(nlen, sizeof(char)); */
        sprintf(nbuff, ": in %s at (%s:%d)", function, file, line);
        len  += nlen;
        buff  = zt_realloc(char, buff, len);
        strcat(buff, nbuff);
        zt_free(nbuff);
    }
    strcat(buff, "\n");
    return buff;
}